

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_lpf1_get_heap_size(ma_lpf1_config *pConfig,size_t *pHeapSizeInBytes)

{
  bool bVar1;
  ma_result mVar2;
  ulong uVar3;
  
  mVar2 = MA_INVALID_ARGS;
  if (pHeapSizeInBytes != (size_t *)0x0) {
    if ((pConfig == (ma_lpf1_config *)0x0) || ((ulong)pConfig->channels == 0)) {
      uVar3 = 0;
      bVar1 = false;
      mVar2 = MA_INVALID_ARGS;
    }
    else {
      uVar3 = (ulong)pConfig->channels * 4 + 7 & 0xfffffffffffffff8;
      bVar1 = true;
      mVar2 = MA_SUCCESS;
    }
    if (bVar1) {
      *pHeapSizeInBytes = uVar3;
      mVar2 = MA_SUCCESS;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_lpf1_get_heap_size(const ma_lpf1_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_lpf1_heap_layout heapLayout;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_lpf1_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    *pHeapSizeInBytes = heapLayout.sizeInBytes;

    return MA_SUCCESS;
}